

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.h
# Opt level: O1

void __thiscall
agge::tests::mocks::mask<8ul>::
mask<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,6>
          (mask<8ul> *this,
          pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> (*cells) [6],
          int y0)

{
  iterator __position;
  int iVar1;
  cell *pcVar2;
  long lVar3;
  int iVar4;
  value_type *__x;
  int i;
  long lVar5;
  int iVar6;
  
  *(int *)(this + 4) = y0;
  *(undefined4 *)(this + 8) = 6;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  iVar6 = -0x7fffffff;
  iVar4 = 0x7fffffff;
  lVar5 = 0;
  do {
    __x = *cells + lVar5;
    __position._M_current =
         *(pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> **)(this + 0x18)
    ;
    if (__position._M_current ==
        *(pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> **)(this + 0x20))
    {
      std::
      vector<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
      ::_M_realloc_insert((vector<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
                           *)(this + 0x10),__position,__x);
    }
    else {
      pcVar2 = __x->second;
      (__position._M_current)->first = __x->first;
      (__position._M_current)->second = pcVar2;
      *(long *)(this + 0x18) = *(long *)(this + 0x18) + 0x10;
    }
    pcVar2 = __x->first;
    lVar3 = (long)__x->second - (long)pcVar2;
    if (lVar3 != 0) {
      lVar3 = (lVar3 >> 2) * -0x5555555555555555;
      do {
        iVar6 = pcVar2->x;
        if (iVar6 <= iVar4) {
          iVar4 = iVar6;
        }
        pcVar2 = pcVar2 + 1;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 6);
  iVar1 = -1;
  if (-1 < iVar6 - iVar4) {
    iVar1 = iVar6 - iVar4;
  }
  *(int *)this = iVar1 + 1;
  return;
}

Assistant:

mask(const T (&cells)[n], int y0)
					: _min_y(y0), _height(n)
				{
					int min_x = 0x7FFFFFFF, max_x = -0x7FFFFFFF;

					for (int i = 0; i != n; ++i)
					{
						_cells.push_back(cells[i]);
						for (int j = 0; j != cells[i].second - cells[i].first; ++j)
						{
							min_x = agge_min(min_x, (cells[i].first + j)->x);
							max_x = agge_max(min_x, (cells[i].first + j)->x);
						}
					}
					_width = agge_max(max_x - min_x, -1) + 1;
				}